

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apanalysis.cpp
# Opt level: O0

int anon_unknown.dwarf_27c::SetOption
              (int argc,char **argv,int *fft_size,double *threshold,int *compression_flag,
              char *filename)

{
  int iVar1;
  int iVar2;
  double dVar3;
  char *filename_local;
  int *compression_flag_local;
  double *threshold_local;
  int *fft_size_local;
  char **argv_local;
  int argc_local;
  
  argv_local._0_4_ = argc;
  do {
    iVar1 = (int)argv_local + -1;
    if (iVar1 == 0) {
      return 1;
    }
    iVar2 = strcmp(argv[iVar1],"-f");
    if (iVar2 == 0) {
      iVar2 = atoi(argv[(int)argv_local]);
      *fft_size = iVar2;
    }
    iVar2 = strcmp(argv[iVar1],"-t");
    if (iVar2 == 0) {
      dVar3 = atof(argv[(int)argv_local]);
      *threshold = dVar3;
    }
    iVar2 = strcmp(argv[iVar1],"-o");
    if (iVar2 == 0) {
      snprintf(filename,200,argv[(int)argv_local]);
    }
    iVar2 = strcmp(argv[iVar1],"-c");
    if (iVar2 == 0) {
      *compression_flag = 1;
    }
    iVar2 = strcmp(argv[iVar1],"-h");
    argv_local._0_4_ = iVar1;
  } while (iVar2 != 0);
  usage(*argv);
  return 0;
}

Assistant:

int SetOption(int argc, char **argv, int *fft_size, double *threshold,
    int *compression_flag, char *filename) {
  while (--argc) {
    if (strcmp(argv[argc], "-f") == 0) *fft_size = atoi(argv[argc + 1]);
    if (strcmp(argv[argc], "-t") == 0) *threshold = atof(argv[argc + 1]);
    if (strcmp(argv[argc], "-o") == 0)
      snprintf(filename, 200, argv[argc + 1]);
    if (strcmp(argv[argc], "-c") == 0) *compression_flag = 1;
    if (strcmp(argv[argc], "-h") == 0) {
      usage(argv[0]);
      return 0;
    }
  }
  return 1;
}